

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CWallet::SetWalletFlag(CWallet *this,uint64_t flags)

{
  bool bVar1;
  runtime_error *this_00;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  WalletDatabase *in_stack_ffffffffffffff40;
  CWallet *in_stack_ffffffffffffff48;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 in_stack_ffffffffffffff5b;
  int in_stack_ffffffffffffff5c;
  uint uVar2;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  allocator<char> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_69 [2];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff78,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,(char *)in_RDI,in_stack_ffffffffffffff5c,(bool)in_stack_ffffffffffffff5b);
  std::__atomic_base<unsigned_long>::operator|=
            ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff78,
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  GetDatabase(in_stack_ffffffffffffff48);
  WalletBatch::WalletBatch
            ((WalletBatch *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (bool)in_stack_ffffffffffffff3f);
  std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff50);
  bVar1 = WalletBatch::WriteWalletFlags
                    ((WalletBatch *)in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff48);
  uVar2 = (uint)CONCAT11(bVar1,bVar1) << 0x10 ^ 0xff0000;
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  if ((uVar2 & 0x10000) == 0) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __lhs = local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,in_RSI,in_stack_ffffffffffffff78);
    std::operator+(__lhs,(char *)this_00);
    std::runtime_error::runtime_error(this_00,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::SetWalletFlag(uint64_t flags)
{
    LOCK(cs_wallet);
    m_wallet_flags |= flags;
    if (!WalletBatch(GetDatabase()).WriteWalletFlags(m_wallet_flags))
        throw std::runtime_error(std::string(__func__) + ": writing wallet flags failed");
}